

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void __thiscall
DConversationMenu::DConversationMenu
          (DConversationMenu *this,FStrifeDialogueNode *CurNode,player_t *player)

{
  int iVar1;
  FFont *font;
  FString FVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  FBrokenLines *pFVar8;
  FStrifeDialogueItemCheck *pFVar9;
  FString local_b0;
  uint local_a4;
  FString local_a0;
  FString byetext;
  char goodbye [25];
  char *goodbyestr;
  FBrokenLines *local_68;
  FBrokenLines *ReplyLines;
  FString ReplyString;
  char *ReplyText;
  int j;
  int i;
  FStrifeDialogueReply *reply;
  FString dlgtext;
  char *toSay;
  player_t *player_local;
  FStrifeDialogueNode *CurNode_local;
  DConversationMenu *this_local;
  
  DMenu::DMenu(&this->super_DMenu,(DMenu *)0x0);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009f6de0;
  FString::FString(&this->mSpeaker);
  TArray<FString,_FString>::TArray(&this->mResponseLines);
  TArray<unsigned_int,_unsigned_int>::TArray(&this->mResponses);
  this->mCurNode = CurNode;
  this->mPlayer = player;
  this->mDialogueLines = (FBrokenLines *)0x0;
  this->mShowGold = false;
  dlgtext.Chars = CurNode->Dialogue;
  iVar4 = strncmp(dlgtext.Chars,"RANDOM_",7);
  if (iVar4 == 0) {
    FString::FString((FString *)&reply);
    FVar2 = dlgtext;
    iVar4 = FRandom::operator()(&pr_randomspeech);
    FString::Format((FString *)&reply,"TXT_%s_%02d",FVar2.Chars,
                    (ulong)(uint)(iVar4 + 1 + (iVar4 / 10) * -10));
    pcVar7 = FString::operator_cast_to_char_((FString *)&reply);
    dlgtext.Chars = FStringTable::operator[](&GStrings,pcVar7);
    if (dlgtext.Chars == (char *)0x0) {
      dlgtext.Chars = FStringTable::operator[](&GStrings,"TXT_GOAWAY");
    }
    FString::~FString((FString *)&reply);
  }
  else if (*dlgtext.Chars == '$') {
    dlgtext.Chars = FStringTable::operator()(&GStrings,dlgtext.Chars + 1);
  }
  font = SmallFont;
  if (dlgtext.Chars == (char *)0x0) {
    dlgtext.Chars = ".";
  }
  iVar4 = DCanvas::GetWidth((DCanvas *)screen);
  pFVar8 = V_BreakLines(font,iVar4 / CleanXfac + -0x30,dlgtext.Chars,false);
  this->mDialogueLines = pFVar8;
  for (_j = CurNode->Children; _j != (FStrifeDialogueReply *)0x0; _j = _j->Next) {
    bVar3 = ShouldSkipReply(_j,this->mPlayer);
    if (!bVar3) {
      this->mShowGold = (this->mShowGold & 1U) != 0 || (_j->NeedsGold & 1U) != 0;
      ReplyString.Chars = _j->Reply;
      if (*ReplyString.Chars == '$') {
        ReplyString.Chars = FStringTable::operator()(&GStrings,ReplyString.Chars + 1);
      }
      FString::FString((FString *)&ReplyLines,ReplyString.Chars);
      if ((_j->NeedsGold & 1U) != 0) {
        pFVar9 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                           (&_j->ItemCheck,0);
        FString::AppendFormat((FString *)&ReplyLines," for %u",(ulong)(uint)pFVar9->Amount);
      }
      local_68 = V_BreakLines(SmallFont,0x104,(FString *)&ReplyLines,false);
      goodbyestr._4_4_ = TArray<FString,_FString>::Size(&this->mResponseLines);
      TArray<unsigned_int,_unsigned_int>::Push(&this->mResponses,(uint *)((long)&goodbyestr + 4));
      ReplyText._0_4_ = 0;
      while (-1 < local_68[(int)ReplyText].Width) {
        TArray<FString,_FString>::Push(&this->mResponseLines,&local_68[(int)ReplyText].Text);
        ReplyText._0_4_ = (int)ReplyText + 1;
      }
      V_FreeBrokenLines(local_68);
      FString::~FString((FString *)&ReplyLines);
    }
  }
  unique0x00012000 = CurNode->Goodbye;
  if (unique0x00012000 == (char *)0x0) {
    iVar4 = FRandom::operator()(&pr_randomspeech);
    mysnprintf((char *)&byetext,0x19,"TXT_RANDOMGOODBYE_%d",
               (ulong)(uint)(iVar4 + 1 + (iVar4 / 3) * -3));
    register0x00000000 = FStringTable::operator[](&GStrings,(char *)&byetext);
  }
  else {
    iVar4 = strncmp(unique0x00012000,"RANDOM_",7);
    if (iVar4 == 0) {
      FString::FString(&local_a0);
      iVar4 = FRandom::operator()(&pr_randomspeech);
      FString::Format(&local_a0,"TXT_%s_%02d",unique0x00012000,
                      (ulong)(uint)(iVar4 + 1 + (iVar4 / 10) * -10));
      pcVar7 = FString::operator_cast_to_char_(&local_a0);
      register0x00000000 = FStringTable::operator[](&GStrings,pcVar7);
      FString::~FString(&local_a0);
    }
    else if (*unique0x00012000 == '$') {
      register0x00000000 = FStringTable::operator()(&GStrings,unique0x00012000 + 1);
    }
  }
  if (stack0xffffffffffffff88 == (char *)0x0) {
    stack0xffffffffffffff88 = "Bye.";
  }
  local_a4 = TArray<FString,_FString>::Size(&this->mResponseLines);
  TArray<unsigned_int,_unsigned_int>::Push(&this->mResponses,&local_a4);
  FString::FString(&local_b0,stack0xffffffffffffff88);
  TArray<FString,_FString>::Push(&this->mResponseLines,&local_b0);
  FString::~FString(&local_b0);
  iVar4 = OptionSettings.mLinespacing;
  uVar5 = TArray<FString,_FString>::Size(&this->mResponseLines);
  iVar4 = MIN<int>(0x8c,0xc0 - uVar5 * iVar4);
  this->mYpos = iVar4;
  ReplyText._4_4_ = 0;
  while (-1 < this->mDialogueLines[ReplyText._4_4_].Width) {
    ReplyText._4_4_ = ReplyText._4_4_ + 1;
  }
  iVar1 = ReplyText._4_4_ * 10 + 0x2c;
  iVar4 = this->mYpos;
  iVar6 = DCanvas::GetHeight((DCanvas *)screen);
  if (iVar4 + -100 <
      iVar1 - (int)((long)((ulong)(uint)((int)((long)iVar6 / (long)CleanYfac) >> 0x1f) << 0x20 |
                          (long)iVar6 / (long)CleanYfac & 0xffffffffU) / 2)) {
    iVar4 = DCanvas::GetHeight((DCanvas *)screen);
    this->mYpos = (iVar1 - (int)((long)((ulong)(uint)((int)((long)iVar4 / (long)CleanYfac) >> 0x1f)
                                        << 0x20 | (long)iVar4 / (long)CleanYfac & 0xffffffffU) / 2))
                  + 100;
  }
  iVar4 = mSelection;
  ConversationMenuY = this->mYpos;
  uVar5 = TArray<unsigned_int,_unsigned_int>::Size(&this->mResponses);
  if ((int)uVar5 <= iVar4) {
    uVar5 = TArray<unsigned_int,_unsigned_int>::Size(&this->mResponses);
    mSelection = uVar5 - 1;
  }
  return;
}

Assistant:

DConversationMenu(FStrifeDialogueNode *CurNode, player_t *player)
	{
		mCurNode = CurNode;
		mPlayer = player;
		mDialogueLines = NULL;
		mShowGold = false;

		// Format the speaker's message.
		const char * toSay = CurNode->Dialogue;
		if (strncmp (toSay, "RANDOM_", 7) == 0)
		{
			FString dlgtext;

			dlgtext.Format("TXT_%s_%02d", toSay, 1+(pr_randomspeech() % NUM_RANDOM_LINES));
			toSay = GStrings[dlgtext];
			if (toSay == NULL)
			{
				toSay = GStrings["TXT_GOAWAY"];	// Ok, it's lame - but it doesn't look like an error to the player. ;)
			}
		}
		else
		{
			// handle string table replacement
			if (toSay[0] == '$')
			{
				toSay = GStrings(toSay + 1);
			}
		}
		if (toSay == NULL)
		{
			toSay = ".";
		}
		mDialogueLines = V_BreakLines (SmallFont, screen->GetWidth()/CleanXfac - 24*2, toSay);

		FStrifeDialogueReply *reply;
		int i,j;
		for (reply = CurNode->Children, i = 1; reply != NULL; reply = reply->Next)
		{
			if (ShouldSkipReply(reply, mPlayer))
			{
				continue;
			}
			mShowGold |= reply->NeedsGold;

			const char *ReplyText = reply->Reply;
			if (ReplyText[0] == '$')
			{
				ReplyText = GStrings(ReplyText + 1);
			}
			FString ReplyString = ReplyText;
			if (reply->NeedsGold) ReplyString.AppendFormat(" for %u", reply->ItemCheck[0].Amount);

			FBrokenLines *ReplyLines = V_BreakLines (SmallFont, 320-50-10, ReplyString);

			mResponses.Push(mResponseLines.Size());
			for (j = 0; ReplyLines[j].Width >= 0; ++j)
			{
				mResponseLines.Push(ReplyLines[j].Text);
			}
			++i;
			V_FreeBrokenLines (ReplyLines);
		}
		const char *goodbyestr = CurNode->Goodbye;
		if (goodbyestr == nullptr)
		{
			char goodbye[25];
			mysnprintf(goodbye, countof(goodbye), "TXT_RANDOMGOODBYE_%d", 1 + (pr_randomspeech() % NUM_RANDOM_GOODBYES));
			goodbyestr = GStrings[goodbye];
		}
		else if (strncmp(goodbyestr, "RANDOM_", 7) == 0)
		{
			FString byetext;

			byetext.Format("TXT_%s_%02d", goodbyestr, 1 + (pr_randomspeech() % NUM_RANDOM_LINES));
			goodbyestr = GStrings[byetext];
		}
		else if (goodbyestr[0] == '$')
		{
			goodbyestr = GStrings(goodbyestr + 1);
		}
		if (goodbyestr == nullptr) goodbyestr = "Bye.";
		mResponses.Push(mResponseLines.Size());
		mResponseLines.Push(FString(goodbyestr));

		// Determine where the top of the reply list should be positioned.
		i = OptionSettings.mLinespacing;
		mYpos = MIN<int> (140, 192 - mResponseLines.Size() * i);
		for (i = 0; mDialogueLines[i].Width >= 0; ++i)
		{ }
		i = 44 + i * 10;
		if (mYpos - 100 < i - screen->GetHeight() / CleanYfac / 2)
		{
			mYpos = i - screen->GetHeight() / CleanYfac / 2 + 100;
		}
		ConversationMenuY = mYpos;
		//ConversationMenu.indent = 50;

		// Because replies can be selectively hidden mResponses.Size() won't be consistent.
		// So make sure mSelection doesn't exceed mResponses.Size(). [FishyClockwork]
		if (mSelection >= (int)mResponses.Size())
		{
			mSelection = mResponses.Size() - 1;
		}
	}